

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O0

bool GetBrepFormFaceIndex
               (ON_Extrusion *extrusion,int extrusion_profile_index,
               double extrusion_profile_parameter,bool bCountProfileDiscontinuities,
               int *brep_form_face_index,ON_Interval *profile_segment_domain)

{
  bool bVar1;
  ON_Curve *local_70;
  double t;
  ON_Curve *pOStack_60;
  int i;
  ON_Curve *profile;
  double t1;
  double t0;
  int profile_count;
  int profile_segment_count;
  ON_Interval *profile_segment_domain_local;
  int *brep_form_face_index_local;
  double dStack_28;
  bool bCountProfileDiscontinuities_local;
  double extrusion_profile_parameter_local;
  ON_Extrusion *pOStack_18;
  int extrusion_profile_index_local;
  ON_Extrusion *extrusion_local;
  
  t0._4_4_ = 0;
  _profile_count = profile_segment_domain;
  profile_segment_domain_local = (ON_Interval *)brep_form_face_index;
  brep_form_face_index_local._7_1_ = bCountProfileDiscontinuities;
  dStack_28 = extrusion_profile_parameter;
  extrusion_profile_parameter_local._4_4_ = extrusion_profile_index;
  pOStack_18 = extrusion;
  t0._0_4_ = ON_Extrusion::ProfileCount(extrusion);
  t1 = -1.23432101234321e+308;
  profile = (ON_Curve *)0xffe5f8bd9e331dd2;
  if ((dStack_28 != -1.23432101234321e+308) || (NAN(dStack_28))) {
    for (t._4_4_ = 0; t._4_4_ < t0._0_4_; t._4_4_ = t._4_4_ + 1) {
      pOStack_60 = ON_Extrusion::Profile(pOStack_18,t._4_4_);
      if (pOStack_60 == (ON_Curve *)0x0) {
        return false;
      }
      if ((((pOStack_60 == (ON_Curve *)0x0) ||
           (bVar1 = ON_Curve::GetDomain(pOStack_60,&t1,(double *)&profile), !bVar1)) ||
          (bVar1 = ON_IsValid(t1), !bVar1)) ||
         ((bVar1 = ON_IsValid((double)profile), !bVar1 || ((double)profile <= t1)))) {
        return false;
      }
      local_70 = profile;
      if ((brep_form_face_index_local._7_1_ & 1) != 0) {
        while( true ) {
          local_70 = profile;
          bVar1 = GetNextProfileSegmentDiscontinuity
                            (pOStack_60,t1,(double)profile,(double *)&local_70);
          if (((!bVar1) || ((double)local_70 <= t1)) || ((double)profile <= (double)local_70))
          goto LAB_004f3027;
          if (((t._4_4_ == extrusion_profile_parameter_local._4_4_) && (t1 <= dStack_28)) &&
             (dStack_28 < (double)local_70)) break;
          t1 = (double)local_70;
          t0._4_4_ = t0._4_4_ + 1;
        }
        profile = local_70;
      }
LAB_004f3027:
      if (t._4_4_ == extrusion_profile_parameter_local._4_4_) break;
      t0._4_4_ = t0._4_4_ + 1;
    }
  }
  else {
    if ((extrusion_profile_parameter_local._4_4_ != t0._0_4_) &&
       (((pOStack_60 = ON_Extrusion::Profile(pOStack_18,extrusion_profile_parameter_local._4_4_),
         pOStack_60 == (ON_Curve *)0x0 ||
         (bVar1 = ON_Curve::GetDomain(pOStack_60,&t1,(double *)&profile), !bVar1)) ||
        ((bVar1 = ON_IsValid(t1), !bVar1 ||
         ((bVar1 = ON_IsValid((double)profile), !bVar1 || ((double)profile <= t1)))))))) {
      return false;
    }
    t0._4_4_ = extrusion_profile_parameter_local._4_4_;
  }
  if (profile_segment_domain_local != (ON_Interval *)0x0) {
    *(int *)profile_segment_domain_local->m_t = t0._4_4_;
  }
  if ((_profile_count != (ON_Interval *)0x0) && (extrusion_profile_parameter_local._4_4_ < t0._0_4_)
     ) {
    ON_Interval::Set(_profile_count,t1,(double)profile);
  }
  return true;
}

Assistant:

static bool GetBrepFormFaceIndex(
        const ON_Extrusion& extrusion,
        int extrusion_profile_index,
        double extrusion_profile_parameter,
        bool bCountProfileDiscontinuities,
        int* brep_form_face_index,
        ON_Interval* profile_segment_domain
        )
{
  // When extrusion_profile_index = profile_count,
  // it means the caller is looking for the index of
  // the bottom cap.
  int profile_segment_count = 0;
  const int profile_count = extrusion.ProfileCount();
  double t0 = ON_UNSET_VALUE;
  double t1 = ON_UNSET_VALUE;
  const ON_Curve* profile;
  if ( ON_UNSET_VALUE == extrusion_profile_parameter )
  {
    if ( extrusion_profile_index != profile_count )
    {
      profile = extrusion.Profile(extrusion_profile_index);
      if (    0 == profile
           || !profile->GetDomain(&t0,&t1) 
           || !ON_IsValid(t0)
           || !ON_IsValid(t1) 
           || !(t0 < t1)
         )
      {
        return false;
      }
    }
    profile_segment_count = extrusion_profile_index;
  }
  else
  {
    for ( int i = 0; i < profile_count; i++ )
    {
      profile = extrusion.Profile(i);
      if ( 0 == profile )
        return false;
      // It is important to use the original profile, "profile_segment"
      // and not the trimmed copy in the GetNextDiscontinuity() loop
      // so the code that creates this brep divides the extrusion profile
      // exactly the same way as the code that calculates component indices.
      if (    0 == profile
           || !profile->GetDomain(&t0,&t1) 
           || !ON_IsValid(t0)
           || !ON_IsValid(t1) 
           || !(t0 < t1)
         )
      {
        return false;
      }

      double t = t1;
      if ( bCountProfileDiscontinuities )
      {
        while ( GetNextProfileSegmentDiscontinuity(profile,t0,t1,&t) )
        {
          if ( t0 < t && t < t1 )
          {
            if ( i == extrusion_profile_index 
                 && t0 <= extrusion_profile_parameter 
                 && extrusion_profile_parameter < t 
               )
            {
              t1 = t;
              break;
            }
            t0 = t;
            t = t1;
            profile_segment_count++;
            continue;
          }
          break;
        }
      }
      if ( i == extrusion_profile_index )
        break;
      profile_segment_count++;
    }
  }

  if ( 0 != brep_form_face_index )
    *brep_form_face_index = profile_segment_count;

  if ( 0 != profile_segment_domain && extrusion_profile_index < profile_count )
    profile_segment_domain->Set(t0,t1);

  return true;
}